

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

void __thiscall crnlib::vector<unsigned_short>::clear(vector<unsigned_short> *this)

{
  vector<unsigned_short> *this_local;
  
  if (this->m_p != (unsigned_short *)0x0) {
    scalar_type<unsigned_short>::destruct_array(this->m_p,this->m_size);
    crnlib_free(this->m_p);
    this->m_p = (unsigned_short *)0x0;
    this->m_size = 0;
    this->m_capacity = 0;
  }
  return;
}

Assistant:

inline void clear()
        {
            if (m_p)
            {
                scalar_type<T>::destruct_array(m_p, m_size);
                crnlib_free(m_p);
                m_p = nullptr;
                m_size = 0;
                m_capacity = 0;
            }
        }